

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void InitializeInverseRealFFT(int fft_size,InverseRealFFT *inverse_real_fft)

{
  undefined8 uVar1;
  ulong uVar2;
  double *out;
  fft_complex *in;
  long lVar3;
  fft_plan *pfVar4;
  fft_plan *pfVar5;
  ulong uVar6;
  byte bVar7;
  fft_plan fStack_68;
  
  bVar7 = 0;
  inverse_real_fft->fft_size = fft_size;
  uVar6 = (long)fft_size << 4;
  uVar2 = (long)fft_size * 8;
  if (fft_size < 0) {
    uVar6 = 0xffffffffffffffff;
    uVar2 = 0xffffffffffffffff;
  }
  out = (double *)operator_new__(uVar2);
  inverse_real_fft->waveform = out;
  in = (fft_complex *)operator_new__(uVar6);
  inverse_real_fft->spectrum = in;
  fft_plan_dft_c2r_1d(&fStack_68,fft_size,in,out,3);
  pfVar4 = &fStack_68;
  pfVar5 = &inverse_real_fft->inverse_fft;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined8 *)pfVar4;
    pfVar5->n = (int)uVar1;
    pfVar5->sign = (int)((ulong)uVar1 >> 0x20);
    pfVar4 = (fft_plan *)((long)pfVar4 + ((ulong)bVar7 * -2 + 1) * 8);
    pfVar5 = (fft_plan *)((long)pfVar5 + (ulong)bVar7 * -0x10 + 8);
  }
  return;
}

Assistant:

void InitializeInverseRealFFT(int fft_size, InverseRealFFT *inverse_real_fft) {
  inverse_real_fft->fft_size = fft_size;
  inverse_real_fft->waveform = new double[fft_size];
  inverse_real_fft->spectrum = new fft_complex[fft_size];
  inverse_real_fft->inverse_fft = fft_plan_dft_c2r_1d(fft_size,
      inverse_real_fft->spectrum, inverse_real_fft->waveform, FFT_ESTIMATE);
}